

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O0

void __thiscall Text::Text(Text *this)

{
  initializer_list<unsigned_int> __l;
  allocator<unsigned_int> local_25;
  uint local_24;
  iterator local_20;
  size_type local_18;
  Text *local_10;
  Text *this_local;
  
  local_10 = this;
  std::__cxx11::u16string::u16string((u16string *)this);
  local_24 = 0;
  local_20 = &local_24;
  local_18 = 1;
  std::allocator<unsigned_int>::allocator(&local_25);
  __l._M_len = local_18;
  __l._M_array = local_20;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->line_offsets,__l,&local_25);
  std::allocator<unsigned_int>::~allocator(&local_25);
  return;
}

Assistant:

Text::Text() : line_offsets{0} {}